

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithConstr(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *vSuper;
  Gia_Man_t *p_00;
  char *pcVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  int iVar10;
  int local_3c;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfa,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfb,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  pGVar6 = Gia_ManPo(p,0);
  if ((pGVar6->field_0x3 & 0x20) == 0) {
    iVar1 = Gia_ObjFaninId0p(p,pGVar6);
    if (iVar1 != 0) {
      vSuper = Vec_IntAlloc(100);
      iVar10 = 1;
      Gia_ManDupWithConstrCollectAnd_rec
                (p,(Gia_Obj_t *)
                   ((ulong)((uint)*(undefined8 *)pGVar6 >> 0x1d & 1) ^
                   (ulong)(pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff))),vSuper,1);
      iVar1 = vSuper->nSize;
      if (iVar1 < 2) {
        __assert_fail("Vec_IntSize(vSuper) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0xc09,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
      }
      Gia_ManLevelNum(p);
      iVar4 = -1;
      local_3c = -1;
      for (iVar9 = 0; iVar1 != iVar9; iVar9 = iVar9 + 1) {
        iVar2 = Vec_IntEntry(vSuper,iVar9);
        iVar3 = Abc_Lit2Var(iVar2);
        iVar3 = Gia_ObjLevelId(p,iVar3);
        if (iVar4 < iVar3) {
          iVar4 = Abc_Lit2Var(iVar2);
          iVar4 = Gia_ObjLevelId(p,iVar4);
          local_3c = iVar2;
        }
      }
      if (local_3c == -1) {
        __assert_fail("iLitBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0xc0f,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
      }
      p_00 = Gia_ManStart(p->nObjs);
      pcVar7 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar7;
      pcVar7 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar7;
      p->pObjs->Value = 0;
      Gia_ManHashAlloc(p_00);
      do {
        if ((p->nObjs <= iVar10) || (pGVar6 = Gia_ManObj(p,iVar10), pGVar6 == (Gia_Obj_t *)0x0)) {
          iVar10 = -1;
          for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
            iVar2 = Vec_IntEntry(vSuper,iVar4);
            iVar9 = iVar10;
            if ((iVar2 != local_3c) && (iVar9 = Gia_ObjLitCopy(p,iVar2), iVar10 != -1)) {
              iVar9 = Gia_ManHashAnd(p_00,iVar10,iVar9);
            }
            iVar10 = iVar9;
          }
          iVar1 = Gia_ObjLitCopy(p,local_3c);
          Gia_ManAppendCo(p_00,iVar1);
          iVar1 = Abc_LitNot(iVar10);
          Gia_ManAppendCo(p_00,iVar1);
          p_00->nConstrs = 1;
          pGVar8 = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
          Vec_IntFree(vSuper);
          return pGVar8;
        }
        uVar5 = (uint)*(undefined8 *)pGVar6;
        if ((~uVar5 & 0x1fffffff) == 0 || (int)uVar5 < 0) {
          if ((~uVar5 & 0x9fffffff) == 0) {
            uVar5 = Gia_ManAppendCi(p_00);
            goto LAB_0055817b;
          }
        }
        else {
          iVar4 = Gia_ObjFanin0Copy(pGVar6);
          iVar9 = Gia_ObjFanin1Copy(pGVar6);
          uVar5 = Gia_ManHashAnd(p_00,iVar4,iVar9);
LAB_0055817b:
          pGVar6->Value = uVar5;
        }
        iVar10 = iVar10 + 1;
      } while( true );
    }
    pcVar7 = "The miter\'s output is a constant.";
  }
  else {
    pcVar7 = "The miter\'s output is not AND-decomposable.";
  }
  puts(pcVar7);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstr( Gia_Man_t * p )
{
    Vec_Int_t * vSuper;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iDriver, iLit, iLitBest = -1, LevelBest = -1;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) == 0 );
    pObj = Gia_ManPo( p, 0 );
    if ( Gia_ObjFaninC0(pObj) )
    {
        printf( "The miter's output is not AND-decomposable.\n" );
        return NULL;
    }
    if ( Gia_ObjFaninId0p(p, pObj) == 0 )
    {
        printf( "The miter's output is a constant.\n" );
        return NULL;
    }
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // find the highest level
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        if ( LevelBest < Gia_ObjLevelId(p, Abc_Lit2Var(iLit)) )
            LevelBest = Gia_ObjLevelId(p, Abc_Lit2Var(iLit)), iLitBest = iLit;
    assert( iLitBest != -1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create AND of nodes
    iDriver = -1;
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        if ( iLit == iLitBest )
            continue;
        if ( iDriver == -1 )
            iDriver = Gia_ObjLitCopy(p, iLit);
        else
            iDriver = Gia_ManHashAnd( pNew, iDriver, Gia_ObjLitCopy(p, iLit) );
    }
    // create the main PO
    Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, iLitBest) );
    // create the constraint PO
    Gia_ManAppendCo( pNew, Abc_LitNot(iDriver) );
    pNew->nConstrs = 1;
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    return pNew;

}